

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O2

void __thiscall
ASTree::findNonRecursive
          (ASTree *this,string *basicString,vector<ASTree_*,_std::allocator<ASTree_*>_> *vector)

{
  pointer ppAVar1;
  ASTree *this_00;
  __type _Var2;
  pointer ppAVar3;
  ASTree *local_58;
  string local_50;
  
  _Var2 = std::operator==(&this->root,basicString);
  if (_Var2) {
    local_58 = this;
    std::vector<ASTree*,std::allocator<ASTree*>>::emplace_back<ASTree*>
              ((vector<ASTree*,std::allocator<ASTree*>> *)vector,&local_58);
  }
  else {
    ppAVar1 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppAVar3 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppAVar3 != ppAVar1; ppAVar3 = ppAVar3 + 1) {
      this_00 = *ppAVar3;
      std::__cxx11::string::string((string *)&local_50,(string *)basicString);
      findNonRecursive(this_00,&local_50,vector);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void ASTree::findNonRecursive(string basicString, vector<ASTree *> &vector) {
    if (root == basicString) {
        vector.emplace_back(this);
        return;
    }
    for (auto child: subtrees) {
        child->findNonRecursive(basicString, vector);
    }
}